

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<long>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  long lVar2;
  long *plVar3;
  Optional<long> OVar4;
  _Storage<long,_true> local_38;
  Optional<long> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  opt.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_4_ =
       indent;
  opt.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._15_1_ =
       fixed;
  if (fixed) {
    lVar2 = Struct::GetField<long>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<long>(this,lVar2,&(fd->value).type,
                      opt.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._8_4_);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      OVar4 = Table::GetOptional<long,long>(table,(fd->value).offset);
      local_38._M_value =
           OVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      opt.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload._M_value._0_1_ =
           OVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
      if (bVar1) {
        plVar3 = std::optional<long>::operator*((optional<long> *)&local_38);
        PrintScalar<long>(this,*plVar3,&(fd->value).type,
                          opt.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._8_4_);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      lVar2 = GetFieldDefault<long>(fd);
      lVar2 = Table::GetField<long>(table,field,lVar2);
      PrintScalar<long>(this,lVar2,&(fd->value).type,
                        opt.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._8_4_);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }